

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O1

char * ret_err(uint64_t ret,uint64_t err)

{
  int iVar1;
  char *in_RAX;
  undefined4 extraout_var;
  size_t sVar2;
  undefined4 extraout_var_00;
  
  ret_err::r[0] = '\0';
  if (ret != 0) {
    iVar1 = sprintf(ret_err::r,", ret: %ld",ret);
    in_RAX = (char *)CONCAT44(extraout_var,iVar1);
  }
  if (err != 0) {
    sVar2 = strlen(ret_err::r);
    iVar1 = sprintf(ret_err::r + sVar2,", %serr: %ld%s",colors->err,err,colors->reset);
    return (char *)CONCAT44(extraout_var_00,iVar1);
  }
  return in_RAX;
}

Assistant:

static const char *ret_err(uint64_t ret, uint64_t err)
{
	static char r[100];
	r[0] = 0;

	if (ret)
		sprintf(r, ", ret: %" PRId64 "", ret);
	if (err)
		sprintf(r + strlen(r), ", %serr: %" PRId64 "%s", colors->err, err, colors->reset);

	return r;
}